

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Strash(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Vec_Int_t *pVVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Gia_Man_t *pGVar6;
  Gia_Man_t *pGVar7;
  char *pcVar8;
  char *pcVar9;
  uint local_40;
  uint local_3c;
  uint local_38;
  
  local_38 = 0;
  Extra_UtilGetoptReset();
  local_3c = 2;
  bVar3 = false;
  local_40 = 0;
  bVar2 = false;
  do {
    while( true ) {
      while (iVar4 = Extra_UtilGetopt(argc,argv,"Lacmrh"), iVar5 = globalUtilOptind, iVar4 == 0x72)
      {
        bVar2 = (bool)(bVar2 ^ 1);
      }
      if (iVar4 < 0x61) break;
      if (iVar4 == 0x61) {
        local_38 = local_38 ^ 1;
      }
      else if (iVar4 == 99) {
        bVar3 = (bool)(bVar3 ^ 1);
      }
      else {
        if (iVar4 != 0x6d) goto LAB_0022712f;
        local_40 = local_40 ^ 1;
      }
    }
    if (iVar4 == -1) {
      pGVar6 = pAbc->pGia;
      if (pGVar6 != (Gia_Man_t *)0x0) {
        pVVar1 = pGVar6->vMapping;
        if ((pVVar1 != (Vec_Int_t *)0x0) && (bVar2)) {
          pGVar6 = Gia_ManDupHashMapping(pGVar6);
          Gia_ManTransferPacking(pGVar6,pAbc->pGia);
          Gia_ManTransferTiming(pGVar6,pAbc->pGia);
          goto LAB_0022722b;
        }
        if (pVVar1 != (Vec_Int_t *)0x0) {
          if (pGVar6->vConfigs != (Vec_Int_t *)0x0) {
            pGVar6 = (Gia_Man_t *)If_ManDeriveGiaFromCells(pGVar6);
            goto LAB_0022722b;
          }
          if (pVVar1 != (Vec_Int_t *)0x0) {
            pGVar6 = (Gia_Man_t *)Dsm_ManDeriveGia(pGVar6,local_40);
            goto LAB_0022722b;
          }
        }
        if (local_40 == 0) {
          if ((bVar3) && (pGVar6->pAigExtra != (Gia_Man_t *)0x0)) {
            if (pGVar6->nBufs != 0) {
              __assert_fail("!Gia_ManBufNum(pAbc->pGia)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abc.c"
                            ,0x6d69,"int Abc_CommandAbc9Strash(Abc_Frame_t *, int, char **)");
            }
            iVar5 = Gia_ManIsSeqWithBoxes(pGVar6);
            if ((iVar5 == 0) && (iVar5 = Gia_ManRegBoxNum(pAbc->pGia), iVar5 == 0)) {
              pGVar6 = Gia_ManDupCollapse(pAbc->pGia,pAbc->pGia->pAigExtra,(Vec_Int_t *)0x0,0);
            }
            else {
              pGVar7 = Gia_ManDupUnshuffleInputs(pAbc->pGia);
              Gia_ManTransferTiming(pGVar7,pAbc->pGia);
              pGVar6 = pGVar7->pAigExtra;
              iVar5 = Gia_ManRegBoxNum(pGVar7);
              pGVar6 = Gia_ManDupCollapse(pGVar7,pGVar6,(Vec_Int_t *)0x0,(uint)(0 < iVar5));
              Gia_ManTransferTiming(pAbc->pGia,pGVar7);
              Gia_ManStop(pGVar7);
            }
            pcVar8 = Abc_FrameReadFlag("silentmode");
            if (pcVar8 != (char *)0x0) goto LAB_0022722b;
            pcVar8 = "Collapsed AIG with boxes and logic of the boxes.";
          }
          else {
            if (pGVar6->pMuxes == (uint *)0x0) {
              pGVar6 = Gia_ManRehash(pGVar6,local_38);
              goto LAB_0022722b;
            }
            pGVar6 = Gia_ManDupNoMuxes(pGVar6);
            pcVar8 = Abc_FrameReadFlag("silentmode");
            if (pcVar8 != (char *)0x0) goto LAB_0022722b;
            pcVar8 = "Generated AIG from AND/XOR/MUX graph.";
          }
        }
        else {
          if (pGVar6->pMuxes != (uint *)0x0) {
            pcVar8 = "Abc_CommandAbc9Strash(): The AIG already has MUXes.\n";
            goto LAB_00226fac;
          }
          pGVar6 = Gia_ManDupMuxes(pGVar6,local_3c);
          pcVar8 = Abc_FrameReadFlag("silentmode");
          if (pcVar8 != (char *)0x0) goto LAB_0022722b;
          pcVar8 = "Generated AND/XOR/MUX graph.";
        }
        puts(pcVar8);
LAB_0022722b:
        if ((!bVar3) || (pAbc->pGia->pAigExtra == (Gia_Man_t *)0x0)) {
          Gia_ManTransferTiming(pGVar6,pAbc->pGia);
          pGVar7 = pAbc->pGia;
          pGVar7->vConfigs = pGVar6->vConfigs;
          pGVar6->vConfigs = (Vec_Int_t *)0x0;
          pGVar7->pCellStr = pGVar6->pCellStr;
          pGVar6->pCellStr = (char *)0x0;
        }
        Abc_FrameUpdateGia(pAbc,pGVar6);
        return 0;
      }
      pcVar8 = "Abc_CommandAbc9Strash(): There is no AIG.\n";
LAB_00226fac:
      iVar5 = -1;
      goto LAB_00227211;
    }
    if (iVar4 != 0x4c) goto LAB_0022712f;
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
      goto LAB_0022712f;
    }
    local_3c = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar5 + 1;
    if ((int)local_3c < 0) {
LAB_0022712f:
      Abc_Print(-2,"usage: &st [-L num] [-acmrh]\n");
      Abc_Print(-2,"\t         performs structural hashing\n");
      pcVar9 = "yes";
      pcVar8 = "yes";
      if (local_38 == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-a     : toggle additional hashing [default = %s]\n",pcVar8);
      pcVar8 = "yes";
      if (!bVar3) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-c     : toggle collapsing hierarchical AIG [default = %s]\n",pcVar8);
      pcVar8 = "yes";
      if (local_40 == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-m     : toggle converting to larger gates [default = %s]\n",pcVar8);
      Abc_Print(-2,
                "\t-L num : create MUX when sum of refs does not exceed this limit [default = %d]\n"
                ,(ulong)local_3c);
      Abc_Print(-2,"\t         (use L = 1 to create AIG with XORs but without MUXes)\n");
      if (!bVar2) {
        pcVar9 = "no";
      }
      Abc_Print(-2,"\t-r     : toggle rehashing AIG while preserving mapping [default = %s]\n",
                pcVar9);
      pcVar8 = "\t-h     : print the command usage\n";
      iVar5 = -2;
LAB_00227211:
      Abc_Print(iVar5,pcVar8);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Strash( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    int c, Limit = 2;
    int fAddStrash = 0;
    int fCollapse = 0;
    int fAddMuxes = 0;
    int fRehashMap = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Lacmrh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            Limit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Limit < 0 )
                goto usage;
            break;
        case 'a':
            fAddStrash ^= 1;
            break;
        case 'c':
            fCollapse ^= 1;
            break;
        case 'm':
            fAddMuxes ^= 1;
            break;
        case 'r':
            fRehashMap ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Strash(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManHasMapping(pAbc->pGia) && fRehashMap )
    {
        pTemp = Gia_ManDupHashMapping( pAbc->pGia );
        Gia_ManTransferPacking( pTemp, pAbc->pGia );
        Gia_ManTransferTiming( pTemp, pAbc->pGia );
    }
    else if ( Gia_ManHasMapping(pAbc->pGia) && pAbc->pGia->vConfigs )
        pTemp = (Gia_Man_t *)If_ManDeriveGiaFromCells( pAbc->pGia );
    else if ( Gia_ManHasMapping(pAbc->pGia) )
        pTemp = (Gia_Man_t *)Dsm_ManDeriveGia( pAbc->pGia, fAddMuxes ); // delay-oriented unmapping
    else if ( fAddMuxes )
    {
        if ( pAbc->pGia->pMuxes )
        {
            Abc_Print( -1, "Abc_CommandAbc9Strash(): The AIG already has MUXes.\n" );
            return 1;
        }
        pTemp = Gia_ManDupMuxes( pAbc->pGia, Limit );
        if ( !Abc_FrameReadFlag("silentmode") )
            printf( "Generated AND/XOR/MUX graph.\n" );
    }
    else if ( fCollapse && pAbc->pGia->pAigExtra )
    {
        assert( !Gia_ManBufNum(pAbc->pGia) );
        if ( Gia_ManIsSeqWithBoxes(pAbc->pGia) || Gia_ManRegBoxNum(pAbc->pGia) )
        {
            Gia_Man_t * pUnshuffled = Gia_ManDupUnshuffleInputs( pAbc->pGia );
            Gia_ManTransferTiming( pUnshuffled, pAbc->pGia );
            pTemp = Gia_ManDupCollapse( pUnshuffled, pUnshuffled->pAigExtra, NULL, Gia_ManRegBoxNum(pUnshuffled) > 0 );
            Gia_ManTransferTiming( pAbc->pGia, pUnshuffled );
            Gia_ManStop( pUnshuffled );
        }
        else
            pTemp = Gia_ManDupCollapse( pAbc->pGia, pAbc->pGia->pAigExtra, NULL, 0 );
        if ( !Abc_FrameReadFlag("silentmode") )
            printf( "Collapsed AIG with boxes and logic of the boxes.\n" );
    }
    else if ( pAbc->pGia->pMuxes )
    {
        pTemp = Gia_ManDupNoMuxes( pAbc->pGia );
        if ( !Abc_FrameReadFlag("silentmode") )
            printf( "Generated AIG from AND/XOR/MUX graph.\n" );
    }
    else
    {
        pTemp = Gia_ManRehash( pAbc->pGia, fAddStrash );
//        if ( !Abc_FrameReadFlag("silentmode") )
//            printf( "Rehashed the current AIG.\n" );
    }
    if ( !(fCollapse && pAbc->pGia->pAigExtra) )
    {
        Gia_ManTransferTiming( pTemp, pAbc->pGia );
        pAbc->pGia->vConfigs = pTemp->vConfigs;     pTemp->vConfigs = NULL;
        pAbc->pGia->pCellStr = pTemp->pCellStr;     pTemp->pCellStr = NULL;
    }
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &st [-L num] [-acmrh]\n" );
    Abc_Print( -2, "\t         performs structural hashing\n" );
    Abc_Print( -2, "\t-a     : toggle additional hashing [default = %s]\n", fAddStrash? "yes": "no" );
    Abc_Print( -2, "\t-c     : toggle collapsing hierarchical AIG [default = %s]\n", fCollapse? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle converting to larger gates [default = %s]\n", fAddMuxes? "yes": "no" );
    Abc_Print( -2, "\t-L num : create MUX when sum of refs does not exceed this limit [default = %d]\n", Limit );
    Abc_Print( -2, "\t         (use L = 1 to create AIG with XORs but without MUXes)\n" );
    Abc_Print( -2, "\t-r     : toggle rehashing AIG while preserving mapping [default = %s]\n", fRehashMap? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}